

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_frameSizeInfo *
ZSTD_findFrameSizeInfo(ZSTD_frameSizeInfo *__return_storage_ptr__,void *src,size_t srcSize)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  ushort *puVar5;
  size_t sVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_48;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    uVar2 = ZSTD_getFrameHeader_advanced(&local_48,src,srcSize,ZSTD_f_zstd1);
    uVar4 = 0xfffffffffffffffe;
    if (uVar2 < 0xffffffffffffff89) {
      if (uVar2 == 0) {
        uVar3 = (ulong)local_48.headerSize;
        puVar5 = (ushort *)((long)src + uVar3);
        sVar6 = 0;
        uVar2 = srcSize - uVar3;
        do {
          uVar9 = 0xffffffffffffffb8;
          if (2 < uVar2) {
            uVar1 = *puVar5;
            uVar3 = (ulong)(uVar1 & 1);
            uVar8 = uVar1 >> 1 & 3;
            uVar9 = (ulong)uVar8;
            if (uVar8 != 1) {
              if (uVar8 == 3) {
                uVar9 = 0xffffffffffffffec;
              }
              else {
                uVar9 = (ulong)(uint3)(CONCAT12((char)puVar5[1],uVar1) >> 3);
              }
            }
          }
          if (uVar9 < 0xffffffffffffff89) {
            uVar9 = uVar9 + 3;
            uVar10 = uVar2 - uVar9;
            if (uVar2 < uVar9) {
              __return_storage_ptr__->compressedSize = 0xffffffffffffffb8;
              goto LAB_0017f0b6;
            }
            puVar5 = (ushort *)((long)puVar5 + uVar9);
            sVar6 = sVar6 + 1;
            cVar7 = ((int)uVar3 != 0) * '\x03';
          }
          else {
            __return_storage_ptr__->compressedSize = uVar9;
LAB_0017f0b6:
            __return_storage_ptr__->decompressedBound = 0xfffffffffffffffe;
            cVar7 = '\x01';
            uVar10 = uVar2;
          }
          uVar2 = uVar10;
        } while (cVar7 == '\0');
        if (cVar7 != '\x03') {
          return __return_storage_ptr__;
        }
        if (local_48.checksumFlag != 0) {
          uVar2 = 0xffffffffffffffb8;
          if (uVar10 < 4) goto LAB_0017f035;
          puVar5 = puVar5 + 2;
        }
        uVar2 = (long)puVar5 - (long)src;
        uVar4 = local_48.blockSizeMax * sVar6;
        if (local_48.frameContentSize != 0xffffffffffffffff) {
          uVar4 = local_48.frameContentSize;
        }
        __return_storage_ptr__->nbBlocks = sVar6;
      }
      else {
        uVar2 = 0xffffffffffffffb8;
      }
    }
  }
  else {
    uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
    uVar3 = 0xffffffffffffffb8;
    if (uVar2 <= srcSize) {
      uVar3 = uVar2;
    }
    uVar2 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar2 = uVar3;
    }
    if (srcSize < uVar2 && uVar2 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9e32,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
    }
    uVar4 = 0;
    __return_storage_ptr__->nbBlocks = 0;
  }
LAB_0017f035:
  __return_storage_ptr__->compressedSize = uVar2;
  __return_storage_ptr__->decompressedBound = uVar4;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.nbBlocks = nbBlocks;
        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : (unsigned long long)nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}